

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::FindGCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  undefined8 uVar1;
  bool bVar2;
  reference str;
  ostream *poVar3;
  char *msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmAlphaNum local_338;
  cmAlphaNum local_308;
  string local_2d8;
  cmAlphaNum local_2b8;
  cmAlphaNum local_288;
  undefined1 local_258 [8];
  string daGlob;
  undefined1 local_218 [8];
  ostringstream cmCTestLog_msg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>
  *lm;
  iterator __end1;
  iterator __begin1;
  LabelMapType *__range1;
  undefined1 local_70 [8];
  Glob gl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmCTestCoverageHandler *this_local;
  
  gl._80_8_ = files;
  cmsys::Glob::Glob((Glob *)local_70);
  cmsys::Glob::RecurseOn((Glob *)local_70);
  cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_70);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
           ::begin(&this->TargetDirs);
  lm = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
          ::end(&this->TargetDirs);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&lm), bVar2) {
    str = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
          ::operator*(&__end1);
    bVar2 = IntersectsFilter(this,&str->second);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      poVar3 = std::operator<<((ostream *)local_218,"   globbing for coverage in: ");
      poVar3 = std::operator<<(poVar3,(string *)str);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x649,msg,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)(daGlob.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      cmAlphaNum::cmAlphaNum(&local_288,&str->first);
      cmAlphaNum::cmAlphaNum(&local_2b8,"/*.da");
      cmStrCat<>((string *)local_258,&local_288,&local_2b8);
      cmsys::Glob::FindFiles((Glob *)local_70,(string *)local_258,(GlobMessages *)0x0);
      uVar1 = gl._80_8_;
      pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_70);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)uVar1,pvVar4);
      cmAlphaNum::cmAlphaNum(&local_308,&str->first);
      cmAlphaNum::cmAlphaNum(&local_338,"/*.gcda");
      cmStrCat<>(&local_2d8,&local_308,&local_338);
      std::__cxx11::string::operator=((string *)local_258,(string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      cmsys::Glob::FindFiles((Glob *)local_70,(string *)local_258,(GlobMessages *)0x0);
      uVar1 = gl._80_8_;
      pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_70);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)uVar1,pvVar4);
      std::__cxx11::string::~string((string *)local_258);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
    ::operator++(&__end1);
  }
  cmsys::Glob::~Glob((Glob *)local_70);
  return;
}

Assistant:

void cmCTestCoverageHandler::FindGCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();

  for (auto const& lm : this->TargetDirs) {
    // Skip targets containing no interesting labels.
    if (!this->IntersectsFilter(lm.second)) {
      continue;
    }

    // Coverage files appear next to their object files in the target
    // support directory.
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "   globbing for coverage in: " << lm.first << std::endl, this->Quiet);
    std::string daGlob = cmStrCat(lm.first, "/*.da");
    gl.FindFiles(daGlob);
    cm::append(files, gl.GetFiles());
    daGlob = cmStrCat(lm.first, "/*.gcda");
    gl.FindFiles(daGlob);
    cm::append(files, gl.GetFiles());
  }
}